

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

IndexRange __thiscall
iDynTree::BerdyHelper::getRangeDOFSensorVariable
          (BerdyHelper *this,BerdySensorTypes sensorType,DOFIndex idx)

{
  long lVar1;
  TraversalIndex TVar2;
  IndexRange IVar3;
  
  lVar1 = iDynTree::IndexRange::InvalidRange();
  if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
    TVar2 = getTraversalIndexFromJointIndex(&this->m_model,&this->m_dynamicsTraversal,idx);
    if (sensorType == DOF_ACCELERATION_SENSOR) {
      lVar1 = (this->berdySensorTypeOffsets).dofAccelerationOffset + TVar2 + -1;
    }
    if (sensorType == DOF_TORQUE_SENSOR) {
      lVar1 = TVar2 + -1 + (this->berdySensorTypeOffsets).dofTorquesOffset;
    }
  }
  else {
    if (sensorType == DOF_ACCELERATION_SENSOR) {
      lVar1 = (this->berdySensorTypeOffsets).dofAccelerationOffset + idx;
    }
    if (sensorType == DOF_TORQUE_SENSOR) {
      lVar1 = idx + (this->berdySensorTypeOffsets).dofTorquesOffset;
    }
  }
  IVar3.size = 1;
  IVar3.offset = lVar1;
  return IVar3;
}

Assistant:

IndexRange BerdyHelper::getRangeDOFSensorVariable(const BerdySensorTypes sensorType, const DOFIndex idx) const
{
    IndexRange ret = IndexRange::InvalidRange();
    ret.size = 1;

    if (m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE)
    {
        // For ORIGINAL_BERDY_FIXED_BASE we know  that DOFIndex is always equalt to JointIndex
        TraversalIndex trvIdx = getTraversalIndexFromJointIndex(m_model,m_dynamicsTraversal,(JointIndex)idx);

        if( sensorType == DOF_ACCELERATION_SENSOR )
        {
            ret.offset = berdySensorTypeOffsets.dofAccelerationOffset + (trvIdx-1);
        }

        if( sensorType == DOF_TORQUE_SENSOR )
        {
            ret.offset = berdySensorTypeOffsets.dofTorquesOffset + (trvIdx-1);
        }
    }
    else
    {
        assert(m_options.berdyVariant == BERDY_FLOATING_BASE);

        if( sensorType == DOF_ACCELERATION_SENSOR )
        {
            ret.offset = berdySensorTypeOffsets.dofAccelerationOffset + idx;
        }

        if( sensorType == DOF_TORQUE_SENSOR )
        {
            ret.offset = berdySensorTypeOffsets.dofTorquesOffset + idx;
        }
    }

    return ret;
}